

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DictionaryTypeHandlerBase<int>::DictionaryTypeHandlerBase
          (DictionaryTypeHandlerBase<int> *this,DictionaryTypeHandlerBase<int> *typeHandler)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  PropertyTypes values;
  undefined4 *puVar5;
  
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,(typeHandler->super_DynamicTypeHandler).slotCapacity,
             (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity,
             (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots,'\x01');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01539de0
  ;
  pBVar1 = (typeHandler->propertyMap).ptr;
  Memory::Recycler::WBSetBit((char *)&this->propertyMap);
  (this->propertyMap).ptr = pBVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->propertyMap);
  this->nextPropertyIndex = typeHandler->nextPropertyIndex;
  pRVar2 = (typeHandler->singletonInstance).ptr;
  Memory::Recycler::WBSetBit((char *)&this->singletonInstance);
  (this->singletonInstance).ptr = pRVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->singletonInstance);
  if (((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x34,"(typeHandler->GetIsInlineSlotCapacityLocked())",
                                "typeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&typeHandler->super_DynamicTypeHandler);
  DynamicTypeHandler::CopyPropertyTypes(&this->super_DynamicTypeHandler,0xf0,values);
  return;
}

Assistant:

DictionaryTypeHandlerBase<T>::DictionaryTypeHandlerBase(DictionaryTypeHandlerBase* typeHandler) :
        DynamicTypeHandler(typeHandler->GetSlotCapacity(), typeHandler->GetInlineSlotCapacity(), typeHandler->GetOffsetOfInlineSlots()),
        propertyMap(typeHandler->propertyMap), nextPropertyIndex(typeHandler->nextPropertyIndex)
#if ENABLE_FIXED_FIELDS
        , singletonInstance(typeHandler->singletonInstance)
#endif
    {
        Assert(typeHandler->GetIsInlineSlotCapacityLocked());
        CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesInlineSlotCapacityLocked | PropertyTypesHasSpecialProperties, typeHandler->GetPropertyTypes());
    }